

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O3

void __thiscall duckdb::ColumnReader::~ColumnReader(ColumnReader *this)

{
  _Head_base<0UL,_duckdb::BssDecoder_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var2;
  _Head_base<0UL,_duckdb::RleBpDecoder_*,_false> _Var3;
  _Head_base<0UL,_duckdb::DbpDecoder_*,_false> _Var4;
  pointer pcVar5;
  _Head_base<0UL,_bool_*,_false> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  
  this->_vptr_ColumnReader = (_func_int **)&PTR__ColumnReader_019a9da0;
  lVar8 = 0;
  do {
    AllocatedData::~AllocatedData
              ((AllocatedData *)
               ((long)&this->encoding_buffers[1].allocated_data.allocator.ptr + lVar8));
    lVar8 = lVar8 + -0x30;
  } while (lVar8 != -0x60);
  _Var1._M_head_impl =
       (this->byte_stream_split_decoder).bss_decoder.
       super_unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BssDecoder_*,_std::default_delete<duckdb::BssDecoder>_>.
       super__Head_base<0UL,_duckdb::BssDecoder_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (BssDecoder *)0x0) {
    operator_delete(_Var1._M_head_impl);
  }
  (this->byte_stream_split_decoder).bss_decoder.
  super_unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BssDecoder_*,_std::default_delete<duckdb::BssDecoder>_>.
  super__Head_base<0UL,_duckdb::BssDecoder_*,_false>._M_head_impl = (BssDecoder *)0x0;
  _Var2._M_head_impl =
       (this->delta_byte_array_decoder).byte_array_data.
       super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)&(this->delta_byte_array_decoder).byte_array_data,
               _Var2._M_head_impl);
  }
  (this->delta_byte_array_decoder).byte_array_data.
  super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  _Var3._M_head_impl =
       (this->rle_decoder).rle_decoder.
       super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
       super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (RleBpDecoder *)0x0) {
    operator_delete(_Var3._M_head_impl);
  }
  (this->rle_decoder).rle_decoder.
  super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
  super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = (RleBpDecoder *)0x0;
  _Var4._M_head_impl =
       (this->delta_binary_packed_decoder).dbp_decoder.
       super_unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>.
       super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl;
  if (_Var4._M_head_impl != (DbpDecoder *)0x0) {
    operator_delete(_Var4._M_head_impl);
  }
  (this->delta_binary_packed_decoder).dbp_decoder.
  super_unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>.
  super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl = (DbpDecoder *)0x0;
  pcVar5 = (this->dictionary_decoder).dictionary_id._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &(this->dictionary_decoder).dictionary_id.field_2) {
    operator_delete(pcVar5);
  }
  _Var6._M_head_impl =
       (this->dictionary_decoder).filter_result.
       super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var6._M_head_impl != (bool *)0x0) {
    operator_delete__(_Var6._M_head_impl);
  }
  (this->dictionary_decoder).filter_result.super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
  _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  _Var2._M_head_impl =
       (this->dictionary_decoder).dictionary.
       super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)&(this->dictionary_decoder).dictionary,
               _Var2._M_head_impl);
  }
  (this->dictionary_decoder).dictionary.
  super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  p_Var7 = (this->dictionary_decoder).dictionary_selection_vector.selection_data.internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  p_Var7 = (this->dictionary_decoder).valid_sel.selection_data.internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  _Var3._M_head_impl =
       (this->dictionary_decoder).dict_decoder.
       super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
       super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (RleBpDecoder *)0x0) {
    operator_delete(_Var3._M_head_impl);
  }
  (this->dictionary_decoder).dict_decoder.
  super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
  super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = (RleBpDecoder *)0x0;
  _Var3._M_head_impl =
       (this->repeated_decoder).
       super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
       super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (RleBpDecoder *)0x0) {
    operator_delete(_Var3._M_head_impl);
  }
  (this->repeated_decoder).
  super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
  super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = (RleBpDecoder *)0x0;
  _Var3._M_head_impl =
       (this->defined_decoder).
       super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
       super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (RleBpDecoder *)0x0) {
    operator_delete(_Var3._M_head_impl);
  }
  (this->defined_decoder).
  super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
  super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = (RleBpDecoder *)0x0;
  p_Var7 = (this->block).internal.
           super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    return;
  }
  return;
}

Assistant:

ColumnReader::~ColumnReader() {
}